

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O3

void __thiscall
FSSMainWindow::FSSMainWindow(FSSMainWindow *this,FSSDataModel *_dataModel,QWidget *parent)

{
  MenuRole MVar1;
  QSplitter *this_00;
  FSSResourceModel *this_01;
  QWidget *pQVar2;
  QTreeView *this_02;
  QMenu *pQVar3;
  QMenu *pQVar4;
  char *pcVar5;
  FSSSourcesView *pFVar6;
  storage_type *psVar7;
  QAction *pQVar8;
  shared_ptr<Data::Source> *psVar9;
  FSSDataModel *index;
  ulong uVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  PSource data_source;
  QAction *action;
  QString local_d8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  long local_a8 [2];
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  QMap<QAction_*,_std::shared_ptr<Data::Source>_> *local_88;
  QAction *local_80;
  PSource local_78;
  QArrayData *local_68;
  char16_t *pcStack_60;
  long local_58;
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QMainWindow::QMainWindow(&this->super_QMainWindow,parent,0);
  *(undefined ***)this = &PTR_metaObject_00155740;
  *(undefined ***)&this->field_0x10 = &PTR__FSSMainWindow_001558f8;
  this->resourceModel = (FSSResourceModel *)0x0;
  local_88 = &this->actions;
  (this->actions).d.d =
       (QMapData<std::map<QAction_*,_std::shared_ptr<Data::Source>,_std::less<QAction_*>,_std::allocator<std::pair<QAction_*const,_std::shared_ptr<Data::Source>_>_>_>_>
        *)0x0;
  this->dataModel = _dataModel;
  this_00 = (QSplitter *)operator_new(0x28);
  QSplitter::QSplitter(this_00,Horizontal,(QWidget *)this);
  QMainWindow::setCentralWidget((QWidget *)this);
  this_01 = (FSSResourceModel *)operator_new(0x10);
  FSSResourceModel::FSSResourceModel(this_01,(QObject *)0x0);
  this->resourceModel = this_01;
  pQVar2 = (QWidget *)operator_new(0x28);
  QVar11.m_data = (storage_type *)0x9;
  QVar11.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar11);
  local_d8.d.d = (Data *)CONCAT44(uStack_b4,local_b8);
  local_d8.d.size = local_a8[0];
  QDockWidget::QDockWidget((QDockWidget *)pQVar2,&local_d8,this,0);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  this_02 = (QTreeView *)operator_new(0x28);
  QTreeView::QTreeView(this_02,pQVar2);
  this->treeResources = this_02;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this_02,0));
  (**(code **)(*(long *)this->treeResources + 0x1c8))(this->treeResources,this->resourceModel);
  QDockWidget::setWidget(pQVar2);
  QMainWindow::addDockWidget((DockWidgetArea)this,(QDockWidget *)0x1);
  pQVar3 = (QMenu *)QMainWindow::menuBar();
  pQVar4 = (QMenu *)operator_new(0x28);
  QVar12.m_data = (storage_type *)0x4;
  QVar12.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar12);
  local_d8.d.d = (Data *)CONCAT44(uStack_b4,local_b8);
  local_d8.d.size = local_a8[0];
  QMenu::QMenu(pQVar4,&local_d8,(QWidget *)this);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QVar13.m_data = (storage_type *)0x6;
  QVar13.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar13);
  local_d8.d.d = (Data *)CONCAT44(uStack_b4,local_b8);
  local_d8.d.size = local_a8[0];
  QKeySequence::QKeySequence((QKeySequence *)&local_b8);
  QMenu::addAction((QString *)pQVar4,(QObject *)&local_d8,(char *)this,
                   (QKeySequence *)"1exportSource()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_b8);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QMenuBar::addMenu(pQVar3);
  QVar14.m_data = (storage_type *)0x7;
  QVar14.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar14);
  local_d8.d.d = (Data *)CONCAT44(uStack_b4,local_b8);
  local_d8.d.size = local_a8[0];
  QKeySequence::QKeySequence((QKeySequence *)&local_b8);
  MVar1 = QMenu::addAction((QString *)pQVar4,(QObject *)&local_d8,(char *)this,
                           (QKeySequence *)"1openSources()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_b8);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QAction::setMenuRole(MVar1);
  pQVar4 = (QMenu *)operator_new(0x28);
  QVar15.m_data = (storage_type *)0x4;
  QVar15.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar15);
  local_d8.d.d = (Data *)CONCAT44(uStack_b4,local_b8);
  local_d8.d.size = local_a8[0];
  QMenu::QMenu(pQVar4,&local_d8,(QWidget *)this);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QMenuBar::addMenu(pQVar3);
  QVar16.m_data = (storage_type *)0x9;
  QVar16.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar16);
  local_d8.d.d = (Data *)CONCAT44(uStack_b4,local_b8);
  local_d8.d.ptr = (char16_t *)CONCAT44(uStack_ac,uStack_b0);
  local_d8.d.size = local_a8[0];
  QKeySequence::QKeySequence((QKeySequence *)&local_b8);
  pcVar5 = (char *)QMenu::addAction((QString *)pQVar4,(QObject *)&local_d8,(char *)pQVar2,
                                    (QKeySequence *)"1setVisible(bool)");
  QKeySequence::~QKeySequence((QKeySequence *)&local_b8);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,8);
    }
  }
  QAction::setCheckable(SUB81(pcVar5,0));
  QObject::connect(local_38,(char *)pQVar2,(QObject *)"2visibilityChanged(bool)",pcVar5,0x141703);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QMenu::addSeparator();
  pFVar6 = (FSSSourcesView *)operator_new(0x40);
  FSSSourcesView::FSSSourcesView(pFVar6,(QWidget *)this_00);
  this->viewSources = pFVar6;
  QWidget::setSizePolicy((QSizePolicy)SUB84(pFVar6,0));
  index = this->dataModel;
  if ((index->data_sources).d.size != 0) {
    uVar10 = 0;
    do {
      FSSDataModel::getDataSource((FSSDataModel *)&local_98,(size_t)index);
      pFVar6 = this->viewSources;
      local_78.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98;
      local_78.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_90._M_pi;
      if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_90._M_pi)->_M_use_count = (local_90._M_pi)->_M_use_count + 1;
        }
      }
      FSSSourcesView::addSource(pFVar6,&local_78);
      if (local_78.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      (**local_98->_vptr_Source)(&local_b8);
      if ((char *)CONCAT44(uStack_b4,local_b8) == (char *)0x0) {
        psVar7 = (storage_type *)0x0;
      }
      else {
        psVar7 = (storage_type *)strlen((char *)CONCAT44(uStack_b4,local_b8));
      }
      QVar17.m_data = psVar7;
      QVar17.m_size = (qsizetype)&local_d8;
      QString::fromUtf8(QVar17);
      local_68 = &(local_d8.d.d)->super_QArrayData;
      pcStack_60 = local_d8.d.ptr;
      local_58 = local_d8.d.size;
      QKeySequence::QKeySequence((QKeySequence *)&local_d8);
      pQVar8 = (QAction *)
               QMenu::addAction((QString *)pQVar4,(QObject *)&local_68,(char *)this,
                                (QKeySequence *)"1switchSource(bool)");
      QKeySequence::~QKeySequence((QKeySequence *)&local_d8);
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,2,8);
        }
      }
      if ((long *)CONCAT44(uStack_b4,local_b8) != local_a8) {
        operator_delete((long *)CONCAT44(uStack_b4,local_b8),local_a8[0] + 1);
      }
      local_80 = pQVar8;
      QAction::setCheckable(SUB81(pQVar8,0));
      QAction::setChecked(SUB81(local_80,0));
      psVar9 = QMap<QAction_*,_std::shared_ptr<Data::Source>_>::operator[](local_88,&local_80);
      (psVar9->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_98;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(psVar9->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                 ,&local_90);
      if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
      }
      uVar10 = uVar10 + 1;
      index = this->dataModel;
    } while (uVar10 < (ulong)(index->data_sources).d.size);
  }
  pcVar5 = (char *)QAbstractItemView::selectionModel();
  QObject::connect(local_40,pcVar5,(QObject *)"2currentChanged(QModelIndex,QModelIndex)",
                   (char *)this,0x141752);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,(char *)this,(QObject *)"2resourceSelected(Data::Resource,uint)",
                   (char *)this->viewSources,0x1417a4);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  return;
}

Assistant:

FSSMainWindow::FSSMainWindow(FSSDataModel *_dataModel, QWidget *parent)
  : QMainWindow(parent)
  , resourceModel(nullptr)
  , dataModel(_dataModel) {
  QSplitter *mainSplitter = new QSplitter(Qt::Horizontal, this);
  setCentralWidget(mainSplitter);

  resourceModel = new FSSResourceModel();

  QDockWidget *dockResources = new QDockWidget("Resources", this);
  treeResources = new QTreeView(dockResources);
  treeResources->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Expanding);
  treeResources->setModel(resourceModel);
  dockResources->setWidget(treeResources);
  addDockWidget(Qt::LeftDockWidgetArea, dockResources);

  QMenuBar *menuBar = this->menuBar();

  QMenu *menuFile = new QMenu("File", this);
  menuFile->addAction("Export", this, SLOT(exportSource()));
  menuBar->addMenu(menuFile);
  QAction *action_src = menuFile->addAction("Sources", this,
                                            SLOT(openSources()));
  action_src->setMenuRole(QAction::PreferencesRole);

  QMenu *menuView = new QMenu("View", this);
  menuBar->addMenu(menuView);
  QAction *action = menuView->addAction("Resources", dockResources,
                                        SLOT(setVisible(bool)));
  action->setCheckable(true);
  connect(dockResources, SIGNAL(visibilityChanged(bool)), action,
          SLOT(setChecked(bool)));

  menuView->addSeparator();

  viewSources = new FSSSourcesView(mainSplitter);
  viewSources->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);

  for (size_t i = 0; i < dataModel->dataSourceCount(); i++) {
    Data::PSource data_source = dataModel->getDataSource(i);
    viewSources->addSource(data_source);
    QAction *action = menuView->addAction(data_source->get_name().c_str(),
                                          this, SLOT(switchSource(bool)));
    action->setCheckable(true);
    action->setChecked(true);
    actions[action] = data_source;
  }

  connect(treeResources->selectionModel(),
          SIGNAL(currentChanged(QModelIndex,QModelIndex)),
          SLOT(onCurrentChanged(QModelIndex,QModelIndex)));

  connect(this, SIGNAL(resourceSelected(Data::Resource,uint)),
          viewSources, SLOT(onResourceSelected(Data::Resource,uint)));
}